

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_class.c
# Opt level: O3

int class_metadata_methods_impl_cb_iterate(map m,map_key key,map_value val,map_cb_iterate_args args)

{
  long lVar1;
  value *ppvVar2;
  value pvVar3;
  
  ppvVar2 = value_to_array(*args);
  pvVar3 = method_metadata((method_conflict)val);
  lVar1 = *(long *)((long)args + 8);
  *(long *)((long)args + 8) = lVar1 + 1;
  ppvVar2[lVar1] = pvVar3;
  return 0;
}

Assistant:

int class_metadata_methods_impl_cb_iterate(map m, map_key key, map_value val, map_cb_iterate_args args)
{
	class_metadata_iterator_args iterator = (class_metadata_iterator_args)args;
	value *v_array = value_to_array(iterator->v);

	(void)m;
	(void)key;

	v_array[iterator->count++] = method_metadata((method)val);

	return 0;
}